

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# call_statement.cpp
# Opt level: O1

string * __thiscall
duckdb::CallStatement::ToString_abi_cxx11_(string *__return_storage_ptr__,CallStatement *this)

{
  pointer pPVar1;
  long *plVar2;
  long *plVar3;
  long *local_60;
  long local_50;
  long lStack_48;
  undefined1 *local_40 [2];
  undefined1 local_30 [16];
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)__return_storage_ptr__,anon_var_dwarf_4f001a4 + 9);
  ::std::__cxx11::string::append((char *)__return_storage_ptr__);
  pPVar1 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
           ::operator->(&this->function);
  (*(pPVar1->super_BaseExpression)._vptr_BaseExpression[8])(local_40);
  plVar2 = (long *)::std::__cxx11::string::replace((ulong)local_40,0,(char *)0x0,0x1f09bf5);
  plVar3 = plVar2 + 2;
  if ((long *)*plVar2 == plVar3) {
    local_50 = *plVar3;
    lStack_48 = plVar2[3];
    local_60 = &local_50;
  }
  else {
    local_50 = *plVar3;
    local_60 = (long *)*plVar2;
  }
  *plVar2 = (long)plVar3;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  ::std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_60);
  if (local_60 != &local_50) {
    operator_delete(local_60);
  }
  if (local_40[0] != local_30) {
    operator_delete(local_40[0]);
  }
  ::std::__cxx11::string::append((char *)__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

string CallStatement::ToString() const {
	string result = "";
	result += "CALL";
	result += " " + function->ToString();
	result += ";";
	return result;
}